

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaYca.cpp
# Opt level: O0

void Imf_2_5::RgbaYca::reconstructChromaVert(int n,Rgba **ycaIn,Rgba *ycaOut)

{
  long in_RDX;
  long *in_RSI;
  int in_EDI;
  float f;
  float fVar1;
  float fVar2;
  int i;
  int local_1c;
  
  for (local_1c = 0; local_1c < in_EDI; local_1c = local_1c + 1) {
    f = half::operator_cast_to_float((half *)(*in_RSI + (long)local_1c * 8));
    fVar1 = half::operator_cast_to_float((half *)(in_RSI[2] + (long)local_1c * 8));
    fVar1 = f * 0.002128 + fVar1 * -0.00754;
    fVar2 = half::operator_cast_to_float((half *)(in_RSI[4] + (long)local_1c * 8));
    fVar2 = fVar2 * 0.019597 + fVar1;
    half::operator_cast_to_float((half *)(in_RSI[6] + (long)local_1c * 8));
    half::operator_cast_to_float((half *)(in_RSI[8] + (long)local_1c * 8));
    half::operator_cast_to_float((half *)(in_RSI[10] + (long)local_1c * 8));
    half::operator_cast_to_float((half *)(in_RSI[0xc] + (long)local_1c * 8));
    half::operator_cast_to_float((half *)(in_RSI[0xe] + (long)local_1c * 8));
    half::operator_cast_to_float((half *)(in_RSI[0x10] + (long)local_1c * 8));
    half::operator_cast_to_float((half *)(in_RSI[0x12] + (long)local_1c * 8));
    half::operator_cast_to_float((half *)(in_RSI[0x14] + (long)local_1c * 8));
    half::operator_cast_to_float((half *)(in_RSI[0x16] + (long)local_1c * 8));
    half::operator_cast_to_float((half *)(in_RSI[0x18] + (long)local_1c * 8));
    half::operator_cast_to_float((half *)(in_RSI[0x1a] + (long)local_1c * 8));
    half::operator=((half *)CONCAT44(fVar2,fVar1),f);
    half::operator_cast_to_float((half *)(*in_RSI + (long)local_1c * 8 + 4));
    half::operator_cast_to_float((half *)(in_RSI[2] + (long)local_1c * 8 + 4));
    half::operator_cast_to_float((half *)(in_RSI[4] + (long)local_1c * 8 + 4));
    half::operator_cast_to_float((half *)(in_RSI[6] + (long)local_1c * 8 + 4));
    half::operator_cast_to_float((half *)(in_RSI[8] + (long)local_1c * 8 + 4));
    half::operator_cast_to_float((half *)(in_RSI[10] + (long)local_1c * 8 + 4));
    half::operator_cast_to_float((half *)(in_RSI[0xc] + (long)local_1c * 8 + 4));
    half::operator_cast_to_float((half *)(in_RSI[0xe] + (long)local_1c * 8 + 4));
    half::operator_cast_to_float((half *)(in_RSI[0x10] + (long)local_1c * 8 + 4));
    half::operator_cast_to_float((half *)(in_RSI[0x12] + (long)local_1c * 8 + 4));
    half::operator_cast_to_float((half *)(in_RSI[0x14] + (long)local_1c * 8 + 4));
    half::operator_cast_to_float((half *)(in_RSI[0x16] + (long)local_1c * 8 + 4));
    half::operator_cast_to_float((half *)(in_RSI[0x18] + (long)local_1c * 8 + 4));
    half::operator_cast_to_float((half *)(in_RSI[0x1a] + (long)local_1c * 8 + 4));
    half::operator=((half *)CONCAT44(fVar2,fVar1),f);
    *(undefined2 *)(in_RDX + 2 + (long)local_1c * 8) =
         *(undefined2 *)(in_RSI[0xd] + 2 + (long)local_1c * 8);
    *(undefined2 *)(in_RDX + 6 + (long)local_1c * 8) =
         *(undefined2 *)(in_RSI[0xd] + 6 + (long)local_1c * 8);
  }
  return;
}

Assistant:

void
reconstructChromaVert (int n,
		       const Rgba * const ycaIn[N],
		       Rgba ycaOut[/*n*/])
{
    for (int i = 0; i < n; ++i)
    {
	ycaOut[i].r = ycaIn[ 0][i].r *  0.002128f +
		      ycaIn[ 2][i].r * -0.007540f +
		      ycaIn[ 4][i].r *  0.019597f +
		      ycaIn[ 6][i].r * -0.043159f +
		      ycaIn[ 8][i].r *  0.087929f +
		      ycaIn[10][i].r * -0.186077f +
		      ycaIn[12][i].r *  0.627123f +
		      ycaIn[14][i].r *  0.627123f +
		      ycaIn[16][i].r * -0.186077f +
		      ycaIn[18][i].r *  0.087929f +
		      ycaIn[20][i].r * -0.043159f +
		      ycaIn[22][i].r *  0.019597f +
		      ycaIn[24][i].r * -0.007540f +
		      ycaIn[26][i].r *  0.002128f;

	ycaOut[i].b = ycaIn[ 0][i].b *  0.002128f +
		      ycaIn[ 2][i].b * -0.007540f +
		      ycaIn[ 4][i].b *  0.019597f +
		      ycaIn[ 6][i].b * -0.043159f +
		      ycaIn[ 8][i].b *  0.087929f +
		      ycaIn[10][i].b * -0.186077f +
		      ycaIn[12][i].b *  0.627123f +
		      ycaIn[14][i].b *  0.627123f +
		      ycaIn[16][i].b * -0.186077f +
		      ycaIn[18][i].b *  0.087929f +
		      ycaIn[20][i].b * -0.043159f +
		      ycaIn[22][i].b *  0.019597f +
		      ycaIn[24][i].b * -0.007540f +
		      ycaIn[26][i].b *  0.002128f;

	ycaOut[i].g = ycaIn[13][i].g;
	ycaOut[i].a = ycaIn[13][i].a;
    }
}